

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

void * glfwGetJoystickUserPointer(int jid)

{
  void *pvVar1;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GordaNN[P]voxel_game/project/third-party/glfw-3.3.1/src/input.c"
                  ,0x448,"void *glfwGetJoystickUserPointer(int)");
  }
  if ((uint)jid < 0x10) {
    if (_glfw.initialized == 0) {
      pvVar1 = (void *)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (_glfw.joysticks[(uint)jid].present == 0) {
      pvVar1 = (void *)0x0;
    }
    else {
      pvVar1 = _glfw.joysticks[(uint)jid].userPointer;
    }
    return pvVar1;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GordaNN[P]voxel_game/project/third-party/glfw-3.3.1/src/input.c"
                ,0x449,"void *glfwGetJoystickUserPointer(int)");
}

Assistant:

GLFWAPI void* glfwGetJoystickUserPointer(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    return js->userPointer;
}